

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_flush_output(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  
  if (ssl->f_send == (mbedtls_ssl_send_t *)0x0) {
    return -0x7100;
  }
  sVar6 = ssl->out_left;
  if (sVar6 == 0) {
    iVar3 = 0;
  }
  else {
    while (sVar6 != 0) {
      uVar2 = (*ssl->f_send)(ssl->p_bio,
                             ssl->out_hdr +
                             ((ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4)
                             - sVar6) + 5,sVar6);
      if ((int)uVar2 < 1) {
        return uVar2;
      }
      sVar6 = ssl->out_left - (ulong)uVar2;
      if (ssl->out_left < (ulong)uVar2) {
        return -0x6c00;
      }
      ssl->out_left = sVar6;
    }
    uVar7 = 8;
    do {
      uVar5 = *(uint *)&ssl->conf->field_0x174 & 2;
      uVar4 = uVar7 & 0xff;
      uVar2 = (uint)uVar4;
      if (uVar2 <= uVar5) goto LAB_00112394;
      uVar7 = (ulong)(uVar2 - 1);
      puVar1 = ssl->out_ctr + (uVar4 - 1);
      *puVar1 = *puVar1 + '\x01';
    } while (*puVar1 == '\0');
    uVar5 = *(uint *)&ssl->conf->field_0x174 & 2;
LAB_00112394:
    iVar3 = -0x6b80;
    if (uVar5 != uVar2) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_ssl_flush_output( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned char *buf, i;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> flush output" ) );

    if( ssl->f_send == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "Bad usage of mbedtls_ssl_set_bio() "
                            "or mbedtls_ssl_set_bio()" ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    /* Avoid incrementing counter if data is flushed */
    if( ssl->out_left == 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= flush output" ) );
        return( 0 );
    }

    while( ssl->out_left > 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "message length: %d, out_left: %d",
                       mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen, ssl->out_left ) );

        buf = ssl->out_hdr + mbedtls_ssl_hdr_len( ssl ) +
              ssl->out_msglen - ssl->out_left;
        ret = ssl->f_send( ssl->p_bio, buf, ssl->out_left );

        MBEDTLS_SSL_DEBUG_RET( 2, "ssl->f_send", ret );

        if( ret <= 0 )
            return( ret );

        if( (size_t)ret > ssl->out_left || ( INT_MAX > SIZE_MAX && ret > SIZE_MAX ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1,
                ( "f_send returned %d bytes but only %lu bytes were sent",
                ret, (unsigned long)ssl->out_left ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        ssl->out_left -= ret;
    }

    for( i = 8; i > ssl_ep_len( ssl ); i-- )
        if( ++ssl->out_ctr[i - 1] != 0 )
            break;

    /* The loop goes to its end iff the counter is wrapping */
    if( i == ssl_ep_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "outgoing message counter would wrap" ) );
        return( MBEDTLS_ERR_SSL_COUNTER_WRAPPING );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= flush output" ) );

    return( 0 );
}